

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost.h
# Opt level: O2

CostType __thiscall wasm::CostAnalyzer::visitCallIndirect(CostAnalyzer *this,CallIndirect *curr)

{
  ArenaVector<wasm::Expression_*> *pAVar1;
  uint uVar2;
  Expression **ppEVar3;
  CostType CVar4;
  undefined1 local_40 [8];
  Iterator __begin2;
  
  uVar2 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                    ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)this,curr->target);
  __begin2.parent = (ArenaVector<wasm::Expression_*> *)0x0;
  CVar4 = uVar2 + 6;
  pAVar1 = (ArenaVector<wasm::Expression_*> *)
           (curr->operands).
           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
  local_40 = (undefined1  [8])&curr->operands;
  while ((__begin2.parent != pAVar1 || (local_40 != (undefined1  [8])&curr->operands))) {
    ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
              operator*((Iterator *)local_40);
    uVar2 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                      ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)this,*ppEVar3);
    CVar4 = CVar4 + uVar2;
    __begin2.parent =
         (ArenaVector<wasm::Expression_*> *)
         ((long)&((__begin2.parent)->
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data +
         1);
  }
  return CVar4;
}

Assistant:

CostType visitCallIndirect(CallIndirect* curr) {
    CostType ret = 6 + visit(curr->target);
    for (auto* child : curr->operands) {
      ret += visit(child);
    }
    return ret;
  }